

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *this)

{
  long lVar1;
  char16_t *pcVar2;
  QAbstractConcatenable *pQVar3;
  QChar *out;
  QLatin1StringView in;
  QLatin1StringView in_00;
  
  lVar1 = (this->a).a.m_size;
  out = (QChar *)(this->a).b.m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,(long)&out->ucs + lVar1 + 1,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  pQVar3 = (QAbstractConcatenable *)(this->a).a.m_size;
  in.m_data = (char *)pcVar2;
  in.m_size = (qsizetype)(this->a).a.m_data;
  QAbstractConcatenable::appendLatin1To(pQVar3,in,out);
  pcVar2 = pcVar2 + (long)pQVar3;
  pQVar3 = (QAbstractConcatenable *)(this->a).b.m_size;
  in_00.m_data = (char *)pcVar2;
  in_00.m_size = (qsizetype)(this->a).b.m_data;
  QAbstractConcatenable::appendLatin1To(pQVar3,in_00,out);
  pcVar2[(long)pQVar3] = this->b;
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }